

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

ValueFunctionPOMDPDiscrete *
AlphaVectorPlanning::VectorSetToValueFunction
          (ValueFunctionPOMDPDiscrete *__return_storage_ptr__,VectorSet *VS,Index a,
          BGPolicyIndex betaI)

{
  value_type vVar1;
  reference pvVar2;
  uint uVar3;
  ulong __n;
  uint uVar4;
  AlphaVector alpha;
  AlphaVector local_58;
  
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar4 = 0; VS->size1_ != (ulong)uVar4; uVar4 = uVar4 + 1) {
    AlphaVector::AlphaVector(&local_58,VS->size2_);
    local_58._m_action = a;
    AlphaVector::SetBetaI(&local_58,betaI);
    uVar3 = 0;
    while( true ) {
      __n = (ulong)uVar3;
      if (VS->size2_ == __n) break;
      vVar1 = (VS->data_).data_[VS->size2_ * (ulong)uVar4 + __n];
      pvVar2 = std::vector<double,_std::allocator<double>_>::at(&local_58._m_values,__n);
      uVar3 = uVar3 + 1;
      *pvVar2 = vVar1;
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
              (__return_storage_ptr__,&local_58);
    AlphaVector::~AlphaVector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

ValueFunctionPOMDPDiscrete
AlphaVectorPlanning::VectorSetToValueFunction(const VectorSet& VS,
                                              Index a,
                                              AlphaVector::BGPolicyIndex betaI)
{
    ValueFunctionPOMDPDiscrete V;

    for(Index i=0;i!=VS.size1();++i)
    {
        AlphaVector alpha(VS.size2());
        alpha.SetAction(a);
        alpha.SetBetaI(betaI);
        for(Index s=0;s!=VS.size2();++s)
            alpha.SetValue(VS(i,s),s);
        V.push_back(alpha);
    }
    return(V);
}